

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * String::toHex(String *__return_storage_ptr__,void *pAddressIn,size_t lSize)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  void *pvVar10;
  char szBuf [100];
  char local_98 [39];
  byte abStack_71 [65];
  
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  uVar7 = (uint)lSize;
  pvVar10 = pAddressIn;
  while (uVar7 != 0) {
    uVar7 = (uint)lSize;
    uVar2 = 0x10;
    if ((int)uVar7 < 0x10) {
      uVar2 = uVar7;
    }
    snprintf(local_98,100," >                                                      %08lX",
             (long)pvVar10 - (long)pAddressIn);
    uVar6 = uVar7;
    if (0xf < (int)uVar7) {
      uVar6 = 0x10;
    }
    iVar8 = 2;
    lVar9 = 0;
    do {
      bVar1 = *(byte *)((long)pvVar10 + lVar9);
      sprintf(local_98 + iVar8,"%02X ",(ulong)bVar1);
      iVar3 = isprint((uint)bVar1);
      bVar5 = 0x2e;
      if (iVar3 != 0) {
        bVar5 = bVar1;
      }
      abStack_71[lVar9] = bVar5;
      iVar3 = iVar8;
      if (((int)lVar9 + 1U & 3) == 0) {
        iVar3 = iVar8 + 1;
        local_98[(long)iVar8 + 3] = ' ';
      }
      iVar8 = iVar3 + 2;
      lVar9 = lVar9 + 1;
    } while (uVar6 != (uint)lVar9);
    (local_98 + (int)(iVar8 - (uint)((uVar2 & 3) == 0)))[0] = '<';
    (local_98 + (int)(iVar8 - (uint)((uVar2 & 3) == 0)))[1] = ' ';
    sVar4 = strlen(local_98);
    if (sVar4 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_98);
    }
    pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar2);
    uVar7 = uVar7 - uVar2;
    lSize = (size_t)uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

String String::toHex(const void *pAddressIn, size_t lSize)
{
    String ret;
    char szBuf[100];
    int lIndent = 1;
    int lOutLen, lIndex, lIndex2, lOutLen2;
    int lRelPos;
    struct {
        const unsigned char *pData;
        unsigned int lSize;
    } buf;
    const unsigned char *pTmp;
    unsigned char ucTmp;
    const unsigned char *pAddress = static_cast<const unsigned char *>(pAddressIn);

    buf.pData = pAddress;
    buf.lSize = lSize;

    while (buf.lSize > 0) {
        pTmp = buf.pData;
        lOutLen = (int)buf.lSize;
        if (lOutLen > 16)
            lOutLen = 16;

        // create a 64-character formatted output line:
        snprintf(szBuf,
                 sizeof(szBuf),
                 " >                            "
                 "                      "
                 "    %08lX",
                 static_cast<long unsigned int>(pTmp - pAddress));
        lOutLen2 = lOutLen;

        for (lIndex = 1 + lIndent, lIndex2 = 53 - 15 + lIndent, lRelPos = 0; lOutLen2; lOutLen2--, lIndex += 2, lIndex2++) {
            ucTmp = *pTmp++;

            sprintf(szBuf + lIndex, "%02X ", (unsigned short)ucTmp);
            if (!isprint(ucTmp))
                ucTmp = '.'; // nonprintable char
            szBuf[lIndex2] = ucTmp;

            if (!(++lRelPos & 3)) // extra blank after 4 bytes
            {
                lIndex++;
                szBuf[lIndex + 2] = ' ';
            }
        }

        if (!(lRelPos & 3))
            lIndex--;

        szBuf[lIndex] = '<';
        szBuf[lIndex + 1] = ' ';

        ret.append(szBuf);

        buf.pData += lOutLen;
        buf.lSize -= lOutLen;
    }
    return ret;
}